

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3983::test_of(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  uint64_t roaring64_bitmap_from_array [4];
  uint64_t auStack_30 [4];
  
  auStack_30[1] = 20000;
  auStack_30[2] = 500000;
  auStack_30[0] = 1;
  r = roaring64_bitmap_of_ptr(3,auStack_30);
  assert_r64_valid((roaring64_bitmap_t *)r);
  _Var1 = roaring64_bitmap_contains(r,1);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x91);
  _Var1 = roaring64_bitmap_contains(r,20000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 20000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x92);
  _Var1 = roaring64_bitmap_contains(r,500000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 500000)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x93);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_of) {
    roaring64_bitmap_t* r = roaring64_bitmap_from(1, 20000, 500000);
    assert_r64_valid(r);
    assert_true(roaring64_bitmap_contains(r, 1));
    assert_true(roaring64_bitmap_contains(r, 20000));
    assert_true(roaring64_bitmap_contains(r, 500000));
    roaring64_bitmap_free(r);
}